

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::Disconnected::receive(Disconnected *this,size_t maxSize)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [23];
  String local_1c8;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[23]>
            (&local_1c8,(Debug *)"\"WebSocket disconnected\"","WebSocket disconnected",in_RCX);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x111d,&local_1c8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  sVar2 = local_1c8.content.size_;
  pcVar1 = local_1c8.content.ptr;
  if (local_1c8.content.ptr != (char *)0x0) {
    local_1c8.content.ptr = (char *)0x0;
    local_1c8.content.size_ = 0;
    (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Message> receive(size_t maxSize) override {
      return KJ_EXCEPTION(DISCONNECTED, "WebSocket disconnected");
    }